

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

int SSL_early_callback_ctx_extension_get
              (SSL_CLIENT_HELLO *client_hello,uint16_t extension_type,uint8_t **out_data,
              size_t *out_len)

{
  bool bVar1;
  CBS cbs;
  
  bVar1 = bssl::ssl_client_hello_get_extension(client_hello,&cbs,extension_type);
  if (bVar1) {
    *out_data = cbs.data;
    *out_len = cbs.len;
  }
  return (uint)bVar1;
}

Assistant:

int SSL_early_callback_ctx_extension_get(const SSL_CLIENT_HELLO *client_hello,
                                         uint16_t extension_type,
                                         const uint8_t **out_data,
                                         size_t *out_len) {
  CBS cbs;
  if (!ssl_client_hello_get_extension(client_hello, &cbs, extension_type)) {
    return 0;
  }

  *out_data = CBS_data(&cbs);
  *out_len = CBS_len(&cbs);
  return 1;
}